

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O2

bool __thiscall hwtest::pgraph::MthdKelvinDepthClamp::is_valid_val(MthdKelvinDepthClamp *this)

{
  pgraph_state *state;
  _Bool _Var1;
  uint uVar2;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  _Var1 = nv04_pgraph_is_kelvin_class(state);
  if (_Var1) {
    uVar2 = (this->super_SingleMthdTest).super_MthdTest.val & 0xfffffeee;
  }
  else {
    _Var1 = nv04_pgraph_is_rankine_class(state);
    uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
    if (_Var1) {
      uVar2 = uVar2 & 0xffffeeee;
    }
    else {
      uVar2 = uVar2 & 0xfffffeee;
    }
  }
  return uVar2 == 0;
}

Assistant:

bool is_valid_val() override {
		if (nv04_pgraph_is_kelvin_class(&exp)) {
			return !(val & ~0x111);
		} else if (nv04_pgraph_is_rankine_class(&exp)) {
			return !(val & ~0x1111);
		} else {
			return !(val & ~0x111);
		}
	}